

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeString::indexOf
          (UnicodeString *this,char16_t *srcChars,int32_t srcLength,int32_t start)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  
  if (start < 0) {
    start = 0;
  }
  else {
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (iVar2 < start) {
      start = iVar2;
    }
  }
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar3 = indexOf(this,srcChars,0,srcLength,start,iVar3 - start);
  return iVar3;
}

Assistant:

inline int32_t
UnicodeString::indexOf(const char16_t *srcChars,
               int32_t srcLength,
               int32_t start) const {
  pinIndex(start);
  return indexOf(srcChars, 0, srcLength, start, length() - start);
}